

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

WatchID __thiscall
efsw::FileWatcherInotify::addWatch
          (FileWatcherInotify *this,string *directory,FileWatchListener *watcher,bool recursive,
          bool syntheticEvents,WatcherInotify *parent,bool fromInternalEvent)

{
  int __fd;
  MutexImpl *pMVar1;
  MutexImpl *pMVar2;
  Lock LVar3;
  bool bVar4;
  Error EVar5;
  uint uVar6;
  bool *pbVar7;
  char *pcVar8;
  int *piVar9;
  WatcherInotify *this_00;
  long lVar10;
  mapped_type *pmVar11;
  mapped_type *ppWVar12;
  pointer ppVar13;
  FileInfo *this_01;
  Mutex *pMVar14;
  pair<int,_efsw::WatcherInotify_*> pVar15;
  WatchID local_410;
  allocator local_371;
  string local_370 [32];
  string local_350 [32];
  FileSystem local_330 [32];
  reference local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
  *file;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  *__range3;
  FileInfo *cfi;
  _Self local_2e0;
  iterator it;
  undefined1 local_2b8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  files;
  Lock l;
  pair<int,_efsw::WatcherInotify_*> local_270;
  Lock local_260;
  Lock lock;
  WatcherInotify *pWatch;
  string local_248 [32];
  string local_228 [36];
  int local_204;
  string local_200 [4];
  int wd;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  FileSystem local_180 [8];
  string link;
  string local_160 [8];
  string curPath;
  string local_140 [32];
  string local_120 [32];
  string local_100 [36];
  undefined4 local_dc;
  string local_d8 [32];
  undefined1 local_b8 [8];
  FileInfo fi;
  string local_60 [8];
  string dir;
  bool fromInternalEvent_local;
  WatcherInotify *parent_local;
  bool syntheticEvents_local;
  bool recursive_local;
  FileWatchListener *watcher_local;
  string *directory_local;
  FileWatcherInotify *this_local;
  
  std::__cxx11::string::string(local_60,(string *)directory);
  FileSystem::dirAddSlashAtEnd((string *)local_60);
  FileInfo::FileInfo((FileInfo *)local_b8,(string *)local_60);
  bVar4 = FileInfo::isDirectory((FileInfo *)local_b8);
  if (!bVar4) {
    std::__cxx11::string::string(local_d8,local_60);
    EVar5 = Errors::Log::createLastError(FileNotFound,(string *)local_d8);
    this_local = (FileWatcherInotify *)(long)EVar5;
    std::__cxx11::string::~string(local_d8);
    local_dc = 1;
    goto LAB_00115473;
  }
  bVar4 = FileInfo::isReadable((FileInfo *)local_b8);
  if (!bVar4) {
    std::__cxx11::string::string(local_100,local_60);
    EVar5 = Errors::Log::createLastError(FileNotReadable,(string *)local_100);
    this_local = (FileWatcherInotify *)(long)EVar5;
    std::__cxx11::string::~string(local_100);
    local_dc = 1;
    goto LAB_00115473;
  }
  uVar6 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,local_60);
  if ((uVar6 & 1) != 0) {
    std::__cxx11::string::string(local_120,(string *)directory);
    EVar5 = Errors::Log::createLastError(FileRepeated,(string *)local_120);
    this_local = (FileWatcherInotify *)(long)EVar5;
    std::__cxx11::string::~string(local_120);
    local_dc = 1;
    goto LAB_00115473;
  }
  if ((parent != (WatcherInotify *)0x0) &&
     (bVar4 = FileSystem::isRemoteFS((string *)local_60), bVar4)) {
    std::__cxx11::string::string(local_140,local_60);
    EVar5 = Errors::Log::createLastError(FileRemote,(string *)local_140);
    this_local = (FileWatcherInotify *)(long)EVar5;
    std::__cxx11::string::~string(local_140);
    local_dc = 1;
    goto LAB_00115473;
  }
  std::__cxx11::string::string(local_160);
  std::__cxx11::string::string(local_1a0,local_60);
  FileSystem::getLinkRealPath(local_180,(string *)local_1a0,(string *)local_160);
  std::__cxx11::string::~string(local_1a0);
  bVar4 = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_180);
  if (bVar4) {
    if ((parent == (WatcherInotify *)0x0) ||
       (pbVar7 = FileWatcher::followSymlinks((this->super_FileWatcherImpl).mFileWatcher),
       (*pbVar7 & 1U) != 0)) {
      uVar6 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,local_180);
      if ((uVar6 & 1) == 0) {
        uVar6 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[9])(this,local_160,local_180);
        if ((uVar6 & 1) != 0) {
          std::__cxx11::string::operator=(local_60,(string *)local_180);
          goto LAB_00114c80;
        }
        std::__cxx11::string::string(local_200,local_60);
        EVar5 = Errors::Log::createLastError(FileOutOfScope,(string *)local_200);
        this_local = (FileWatcherInotify *)(long)EVar5;
        std::__cxx11::string::~string(local_200);
      }
      else {
        std::__cxx11::string::string(local_1e0,(string *)directory);
        EVar5 = Errors::Log::createLastError(FileRepeated,(string *)local_1e0);
        this_local = (FileWatcherInotify *)(long)EVar5;
        std::__cxx11::string::~string(local_1e0);
      }
    }
    else {
      std::__cxx11::string::string(local_1c0,local_60);
      EVar5 = Errors::Log::createLastError(FileOutOfScope,(string *)local_1c0);
      this_local = (FileWatcherInotify *)(long)EVar5;
      std::__cxx11::string::~string(local_1c0);
    }
  }
  else {
LAB_00114c80:
    __fd = this->mFD;
    pcVar8 = (char *)std::__cxx11::string::c_str();
    local_204 = inotify_add_watch(__fd,pcVar8,0x3ca);
    if (local_204 < 0) {
      piVar9 = __errno_location();
      if (*piVar9 == 2) {
        std::__cxx11::string::string(local_228,local_60);
        EVar5 = Errors::Log::createLastError(FileNotFound,(string *)local_228);
        this_local = (FileWatcherInotify *)(long)EVar5;
        std::__cxx11::string::~string(local_228);
      }
      else {
        piVar9 = __errno_location();
        pcVar8 = strerror(*piVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_248,pcVar8,(allocator *)((long)&pWatch + 7));
        EVar5 = Errors::Log::createLastError(Unspecified,(string *)local_248);
        this_local = (FileWatcherInotify *)(long)EVar5;
        std::__cxx11::string::~string(local_248);
        std::allocator<char>::~allocator((allocator<char> *)((long)&pWatch + 7));
      }
    }
    else {
      this_00 = (WatcherInotify *)operator_new(0xc0);
      WatcherInotify::WatcherInotify(this_00);
      (this_00->super_Watcher).Listener = watcher;
      if (parent == (WatcherInotify *)0x0) {
        local_410 = (WatchID)local_204;
      }
      else {
        local_410 = (parent->super_Watcher).ID;
      }
      (this_00->super_Watcher).ID = local_410;
      this_00->InotifyID = (long)local_204;
      lock.mMutex = (Mutex *)this_00;
      std::__cxx11::string::operator=((string *)&(this_00->super_Watcher).Directory,local_60);
      *(bool *)&lock.mMutex[7].mMutexImpl = recursive;
      lock.mMutex[0xc].mMutexImpl = (MutexImpl *)parent;
      Lock::Lock(&local_260,&this->mWatchesLock);
      pVar15 = std::make_pair<int&,efsw::WatcherInotify*&>(&local_204,(WatcherInotify **)&lock);
      local_270.second = pVar15.second;
      local_270.first = pVar15.first;
      std::
      map<long,efsw::WatcherInotify*,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
      ::insert<std::pair<int,efsw::WatcherInotify*>>
                ((map<long,efsw::WatcherInotify*,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                  *)&this->mWatches,&local_270);
      lVar10 = (long)local_204;
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                ::operator[](&this->mWatchesRef,(key_type *)(lock.mMutex + 2));
      *pmVar11 = lVar10;
      Lock::~Lock(&local_260);
      if (lock.mMutex[0xc].mMutexImpl == (MutexImpl *)0x0) {
        Lock::Lock((Lock *)&files._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &this->mRealWatchesLock);
        LVar3 = lock;
        ppWVar12 = std::
                   map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                   ::operator[](&this->mRealWatches,(key_type *)(lock.mMutex + 0xd));
        *ppWVar12 = (mapped_type)LVar3.mMutex;
        Lock::~Lock((Lock *)&files._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      if (((ulong)lock.mMutex[7].mMutexImpl & 1) != 0) {
        std::__cxx11::string::string((string *)&it,(string *)(lock.mMutex + 2));
        FileSystem::filesInfoFromPath((FileInfoMap *)local_2b8,(string *)&it);
        std::__cxx11::string::~string((string *)&it);
        local_2e0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                      *)local_2b8);
        while( true ) {
          cfi = (FileInfo *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                       *)local_2b8);
          bVar4 = std::operator!=(&local_2e0,(_Self *)&cfi);
          if ((!bVar4) ||
             (bVar4 = Atomic::operator_cast_to_bool
                                ((Atomic *)&(this->super_FileWatcherImpl).mInitOK), !bVar4)) break;
          ppVar13 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                    ::operator->(&local_2e0);
          this_01 = &ppVar13->second;
          bVar4 = FileInfo::isDirectory(this_01);
          if ((bVar4) && (bVar4 = FileInfo::isReadable(this_01), bVar4)) {
            addWatch(this,&this_01->Filepath,watcher,recursive,syntheticEvents,
                     (WatcherInotify *)lock.mMutex,false);
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
          ::operator++(&local_2e0);
        }
        if ((fromInternalEvent) && ((parent != (WatcherInotify *)0x0 && (syntheticEvents)))) {
          __end3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                            *)local_2b8);
          file = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                           *)local_2b8);
          while (bVar4 = std::operator!=(&__end3,(_Self *)&file), bVar4) {
            local_310 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                        ::operator*(&__end3);
            bVar4 = FileInfo::isRegularFile(&local_310->second);
            if (bVar4) {
              pMVar1 = lock.mMutex[1].mMutexImpl;
              pMVar2 = lock.mMutex[6].mMutexImpl;
              pMVar14 = lock.mMutex + 2;
              std::__cxx11::string::string(local_350,(string *)&local_310->second);
              FileSystem::fileNameFromPath(local_330,(string *)local_350);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_370,"",&local_371);
              (**(code **)((pMVar2->mMutex).__align + 0x10))
                        (pMVar2,pMVar1,pMVar14,local_330,1,local_370);
              std::__cxx11::string::~string(local_370);
              std::allocator<char>::~allocator((allocator<char> *)&local_371);
              std::__cxx11::string::~string((string *)local_330);
              std::__cxx11::string::~string(local_350);
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
            ::operator++(&__end3);
          }
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                *)local_2b8);
      }
      this_local = (FileWatcherInotify *)(long)local_204;
    }
  }
  local_dc = 1;
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string(local_160);
LAB_00115473:
  FileInfo::~FileInfo((FileInfo *)local_b8);
  std::__cxx11::string::~string(local_60);
  return (WatchID)this_local;
}

Assistant:

WatchID FileWatcherInotify::addWatch( const std::string& directory, FileWatchListener* watcher,
									  bool recursive, bool syntheticEvents,
									  WatcherInotify* parent, bool fromInternalEvent ) {
	std::string dir( directory );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() ) {
		return Errors::Log::createLastError( Errors::FileNotFound, dir );
	} else if ( !fi.isReadable() ) {
		return Errors::Log::createLastError( Errors::FileNotReadable, dir );
	} else if ( pathInWatches( dir ) ) {
		return Errors::Log::createLastError( Errors::FileRepeated, directory );
	} else if ( NULL != parent && FileSystem::isRemoteFS( dir ) ) {
		return Errors::Log::createLastError( Errors::FileRemote, dir );
	}

	/// Check if the directory is a symbolic link
	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );

	if ( "" != link ) {
		/// Avoid adding symlinks directories if it's now enabled
		if ( NULL != parent && !mFileWatcher->followSymlinks() ) {
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( pathInWatches( link ) ) {
			return Errors::Log::createLastError( Errors::FileRepeated, directory );
		} else if ( !linkAllowed( curPath, link ) ) {
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		} else {
			dir = link;
		}
	}

	int wd = inotify_add_watch( mFD, dir.c_str(),
								IN_CLOSE_WRITE | IN_MOVED_TO | IN_CREATE | IN_MOVED_FROM |
									IN_DELETE | IN_MODIFY );

	if ( wd < 0 ) {
		if ( errno == ENOENT ) {
			return Errors::Log::createLastError( Errors::FileNotFound, dir );
		} else {
			return Errors::Log::createLastError( Errors::Unspecified,
												 std::string( strerror( errno ) ) );
		}
	}

	efDEBUG( "Added watch %s with id: %d\n", dir.c_str(), wd );

	WatcherInotify* pWatch = new WatcherInotify();
	pWatch->Listener = watcher;
	pWatch->ID = parent ? parent->ID : wd;
	pWatch->InotifyID = wd;
	pWatch->Directory = dir;
	pWatch->Recursive = recursive;
	pWatch->Parent = parent;

	{
		Lock lock( mWatchesLock );
		mWatches.insert( std::make_pair( wd, pWatch ) );
		mWatchesRef[pWatch->Directory] = wd;
	}

	if ( NULL == pWatch->Parent ) {
		Lock l( mRealWatchesLock );
		mRealWatches[pWatch->InotifyID] = pWatch;
	}

	if ( pWatch->Recursive ) {
		std::map<std::string, FileInfo> files = FileSystem::filesInfoFromPath( pWatch->Directory );
		std::map<std::string, FileInfo>::iterator it = files.begin();

		for ( ; it != files.end(); ++it ) {
			if ( !mInitOK )
				break;

			const FileInfo& cfi = it->second;

			if ( cfi.isDirectory() && cfi.isReadable() ) {
				addWatch( cfi.Filepath, watcher, recursive, syntheticEvents, pWatch );
			}
		}

		if ( fromInternalEvent && parent != NULL && syntheticEvents ) {
			for ( const auto& file : files ) {
				if ( file.second.isRegularFile() ) {
					pWatch->Listener->handleFileAction(
						pWatch->ID, pWatch->Directory,
						FileSystem::fileNameFromPath( file.second.Filepath ), Actions::Add );
				}
			}
		}
	}

	return wd;
}